

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

void __thiscall
ValueHashTable<ExprHash,_Value_*>::ValueHashTable
          (ValueHashTable<ExprHash,_Value_*> *this,JitArenaAllocator *allocator,uint tableSize)

{
  DictionaryStats *pDVar1;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  pDVar1 = DictionaryStats::Create("P14ValueHashTableI8ExprHashP5ValueE",tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

ValueHashTable(JitArenaAllocator * allocator, uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }